

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_tuple_primitive_firstInstance
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 0) {
    sysbvm_error_argumentCountMismatch(0,argumentCount);
  }
  if ((context->heap).firstMallocObject == (sysbvm_heap_mallocObjectHeader_t *)0x0) {
    context_local = (sysbvm_context_t *)0x0;
  }
  else {
    context_local = (sysbvm_context_t *)((context->heap).firstMallocObject + 1);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_firstInstance(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    (void)arguments;
    if(argumentCount != 0) sysbvm_error_argumentCountMismatch(0, argumentCount);

    if(!context->heap.firstMallocObject)
        return SYSBVM_NULL_TUPLE;

    return (sysbvm_tuple_t)(context->heap.firstMallocObject + 1);
}